

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfindrep.h
# Opt level: O1

void __thiscall re_replace_arg::search(re_replace_arg *this,char *str,int start_idx,char *last_str)

{
  ushort uVar1;
  ushort *puVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  byte *blen;
  byte *alen;
  size_t ml;
  int local_50;
  int local_38 [2];
  
  puVar2 = (ushort *)this->pat_str;
  lVar4 = (long)start_idx;
  if (puVar2 != (ushort *)0x0) {
    this->match_len = 0;
    this->match_valid = 1;
    local_50 = (int)str + 2;
    blen = (byte *)((ulong)*(ushort *)str - lVar4);
    uVar1 = *puVar2;
    alen = (byte *)(ulong)uVar1;
    if ((this->flags & 2) == 0) {
      if (alen <= blen) {
        pbVar5 = (byte *)(str + lVar4 + 2);
        do {
          iVar3 = bcmp(pbVar5,puVar2 + 1,(size_t)alen);
          if (iVar3 == 0) {
            this->match_len = (uint)uVar1;
            this->match_idx = (int)pbVar5 - local_50;
            return;
          }
          blen = pbVar5 + ((long)blen -
                          (long)(pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 &
                                                 (uint)(*pbVar5 >> 7) * 3) + 1));
          pbVar5 = pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 & (uint)(*pbVar5 >> 7) * 3) + 1;
        } while (alen <= blen);
      }
    }
    else if (alen <= blen) {
      pbVar5 = (byte *)(str + lVar4 + 2);
      do {
        iVar3 = t3_compare_case_fold
                          (this->pat_str + 2,(size_t)alen,(char *)pbVar5,(size_t)blen,
                           (size_t *)local_38);
        if (iVar3 == 0) {
          this->match_idx = (int)pbVar5 - local_50;
          this->match_len = local_38[0];
          return;
        }
        blen = pbVar5 + ((long)blen -
                        (long)(pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 &
                                               (uint)(*pbVar5 >> 7) * 3) + 1));
        pbVar5 = pbVar5 + (ulong)(((*pbVar5 >> 5 & 1) != 0) + 1 & (uint)(*pbVar5 >> 7) * 3) + 1;
      } while (alen <= blen);
    }
    this->match_idx = -1;
  }
  if (this->pat == (re_compiled_pattern *)0x0) {
    this->match_idx = -1;
  }
  else {
    iVar3 = CRegexSearcherSimple::search_for_pattern
                      (this->s,this->pat,str + 2,last_str,(ulong)*(ushort *)str - lVar4,
                       &this->match_len);
    this->match_idx = iVar3;
    if (-1 < iVar3) {
      this->match_idx = iVar3 + start_idx;
    }
  }
  this->match_valid = 1;
  return;
}

Assistant:

void search(VMG_ const char *str, int start_idx, const char *last_str)
    {
        /* if we have a pattern, search for it */
        if (pat_str != 0)
        {
            /* 
             *   whether or not we find a match, the search will be valid
             *   when we return 
             */
            match_valid = TRUE;
            match_len = 0;

            /* set up a pointer to the current position */
            utf8_ptr p((char *)str + VMB_LEN + start_idx);

            /* figure the number of bytes left in the string */
            size_t rem = vmb_get_len(str) - start_idx;

            /* note the length of the search string */
            size_t pat_len = vmb_get_len(pat_str);

            /* scan for a match, according to case sensitivity */
            if (!(flags & VMBIFTADS_REPLACE_NOCASE))
            {
                /* case sensitive - scan for a match */
                for ( ; rem >= pat_len ; p.inc(&rem))
                {
                    /* no case folding, so simply compare byte by byte */
                    if (memcmp(p.getptr(), pat_str + VMB_LEN, pat_len) == 0)
                    {
                        /* success - remember the match length and position */
                        match_len = pat_len;
                        match_idx = p.getptr() - (str + VMB_LEN);

                        /* we're done */
                        return;
                    }
                }
            }
            else
            {
                /* case-insensitive - scan for a match */
                for ( ; rem >= pat_len ; p.inc(&rem))
                {
                    /* compare with case folding */
                    size_t ml;
                    if (t3_compare_case_fold(
                        pat_str + VMB_LEN, pat_len,
                        p.getptr(), rem, &ml) == 0)
                    {
                        /* success - set the match index, and we're done */
                        match_idx = p.getptr() - (str + VMB_LEN);
                        match_len = ml;
                        return;
                    }
                }
            }

            /* we didn't a match - set the match index to so indicate */
            match_idx = -1;
        }
        if (pat != 0)
        {
            /* search for the regular expression */
            match_idx = s->search_for_pattern(
                pat, str + VMB_LEN, last_str,
                vmb_get_len(str) - start_idx, &match_len);

            /* if we found it, adjust to the absolute offset in the string */
            if (match_idx >= 0)
                match_idx += start_idx;
        }
        else
        {
            /* no pattern -> no match */
            match_idx = -1;
        }

        /* whether or not we matched, our result is now valid */
        match_valid = TRUE;
    }